

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_optimizer.cpp
# Opt level: O0

void glslopt_shader_get_uniform_desc
               (glslopt_shader *shader,int index,char **outName,glslopt_basic_type *outType,
               glslopt_precision *outPrec,int *outVecSize,int *outMatSize,int *outArraySize,
               int *outLocation)

{
  glslopt_shader_var *pgVar1;
  glslopt_shader_var *v;
  int *outVecSize_local;
  glslopt_precision *outPrec_local;
  glslopt_basic_type *outType_local;
  char **outName_local;
  int index_local;
  glslopt_shader *shader_local;
  
  pgVar1 = shader->uniforms + index;
  *outName = pgVar1->name;
  *outType = pgVar1->type;
  *outPrec = pgVar1->prec;
  *outVecSize = pgVar1->vectorSize;
  *outMatSize = pgVar1->matrixSize;
  *outArraySize = pgVar1->arraySize;
  *outLocation = pgVar1->location;
  return;
}

Assistant:

void glslopt_shader_get_uniform_desc (glslopt_shader* shader, int index, const char** outName, glslopt_basic_type* outType, glslopt_precision* outPrec, int* outVecSize, int* outMatSize, int* outArraySize, int* outLocation)
{
	const glslopt_shader_var& v = shader->uniforms[index];
	*outName = v.name;
	*outType = v.type;
	*outPrec = v.prec;
	*outVecSize = v.vectorSize;
	*outMatSize = v.matrixSize;
	*outArraySize = v.arraySize;
	*outLocation = v.location;
}